

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O0

char * google::glog_internal_namespace_::const_basename(char *filepath)

{
  char *pcVar1;
  char *local_20;
  char *base;
  char *filepath_local;
  
  pcVar1 = strrchr(filepath,0x2f);
  local_20 = filepath;
  if (pcVar1 != (char *)0x0) {
    local_20 = pcVar1 + 1;
  }
  return local_20;
}

Assistant:

const char* const_basename(const char* filepath) {
  const char* base = strrchr(filepath, '/');
#ifdef OS_WINDOWS  // Look for either path separator in Windows
  if (!base)
    base = strrchr(filepath, '\\');
#endif
  return base ? (base+1) : filepath;
}